

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O3

void __thiscall
Lib::Set<SAT::SATLiteral,_Lib::DefaultHash>::expand(Set<SAT::SATLiteral,_Lib::DefaultHash> *this)

{
  long lVar1;
  Cell *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Cell *res;
  Cell *pCVar5;
  Cell *pCVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  bool dummy;
  bool local_35;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 local_34;
  
  iVar7 = 0x1f;
  if (this->_capacity != 0) {
    iVar7 = this->_capacity * 2;
  }
  lVar10 = (long)iVar7;
  pCVar2 = this->_entries;
  uVar9 = lVar10 * 8 + 0xfU & 0xfffffffffffffff0;
  if (uVar9 == 0) {
    pCVar5 = (Cell *)FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar9 < 0x11) {
    pCVar5 = (Cell *)FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar9 < 0x19) {
    pCVar5 = (Cell *)FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar9 < 0x21) {
    pCVar5 = (Cell *)FixedSizeAllocator<32UL>::alloc
                               ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar9 < 0x31) {
    pCVar5 = (Cell *)FixedSizeAllocator<48UL>::alloc
                               ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar9 < 0x41) {
    pCVar5 = (Cell *)FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pCVar5 = (Cell *)::operator_new(uVar9,0x10);
  }
  auVar4 = _DAT_0084f040;
  auVar3 = _DAT_0084f030;
  auVar12 = _DAT_0084f020;
  if (iVar7 != 0) {
    lVar1 = lVar10 + -1;
    auVar11._8_4_ = (int)lVar1;
    auVar11._0_8_ = lVar1;
    auVar11._12_4_ = (int)((ulong)lVar1 >> 0x20);
    uVar9 = 0;
    auVar11 = auVar11 ^ _DAT_0084f040;
    do {
      auVar14._8_4_ = (int)uVar9;
      auVar14._0_8_ = uVar9;
      auVar14._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar14 | auVar3) ^ auVar4;
      iVar13 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        pCVar5[uVar9].code = 0;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        pCVar5[uVar9 + 1].code = 0;
      }
      auVar14 = (auVar14 | auVar12) ^ auVar4;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar11._0_4_)) {
        pCVar5[uVar9 + 2].code = 0;
        pCVar5[uVar9 + 3].code = 0;
      }
      uVar9 = uVar9 + 4;
    } while ((lVar10 + 3U & 0xfffffffffffffffc) != uVar9);
  }
  this->_entries = pCVar5;
  auVar12._8_4_ = iVar7 >> 0x1f;
  auVar12._0_8_ = lVar10;
  auVar12._12_4_ = 0x45300000;
  this->_afterLast = pCVar5 + lVar10;
  this->_maxEntries =
       (int)(((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) * 0.8);
  iVar13 = this->_capacity;
  this->_capacity = iVar7;
  uVar8 = this->_size;
  this->_nonemptyCells = 0;
  this->_size = 0;
  if (uVar8 != 0) {
    pCVar5 = pCVar2;
    do {
      do {
        pCVar6 = pCVar5;
        pCVar5 = pCVar6 + 1;
      } while (pCVar6->code < 2);
      local_34 = (pCVar6->value).field_0;
      Set<SAT::SATLiteral,Lib::DefaultHash>::
      rawFindOrInsert<Lib::Set<SAT::SATLiteral,Lib::DefaultHash>::insert(SAT::SATLiteral,unsigned_int)::_lambda()_1_,Lib::Set<SAT::SATLiteral,Lib::DefaultHash>::insert(SAT::SATLiteral,unsigned_int)::_lambda(auto:1)_1_>
                ((Set<SAT::SATLiteral,Lib::DefaultHash> *)this,(SATLiteral *)&local_34,pCVar6->code,
                 (SATLiteral *)&local_34,&local_35);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if (pCVar2 != (Cell *)0x0) {
    uVar9 = (long)iVar13 * 8 + 0xfU & 0xfffffffffffffff0;
    if (uVar9 == 0) {
      pCVar2->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      pCVar2->value = (SATLiteral)GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pCVar2;
    }
    else if (uVar9 < 0x11) {
      pCVar2->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      pCVar2->value = (SATLiteral)GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar2;
    }
    else if (uVar9 < 0x19) {
      pCVar2->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      pCVar2->value = (SATLiteral)GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pCVar2;
    }
    else if (uVar9 < 0x21) {
      pCVar2->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      pCVar2->value = (SATLiteral)GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pCVar2;
    }
    else if (uVar9 < 0x31) {
      pCVar2->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      pCVar2->value = (SATLiteral)GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pCVar2;
    }
    else if (uVar9 < 0x41) {
      pCVar2->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      pCVar2->value = (SATLiteral)GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pCVar2;
    }
    else {
      operator_delete(pCVar2,0x10);
    }
  }
  return;
}

Assistant:

void expand()
  {
    size_t newCapacity = _capacity ? _capacity * 2 : 31;
    Cell* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Cell),"Set::Cell");

    _entries = array_new<Cell>(mem, newCapacity);
    _afterLast = _entries + newCapacity;
    _maxEntries = (int)(newCapacity * 0.8);
    size_t oldCapacity = _capacity;
    _capacity = newCapacity;

    // experiments using (a) random numbers (b) consecutive numbers
    // and 30,000,000 allocations
    // 0.6 :  8.49 7.55
    // 0.7 :  9.19 7.71
    // 0.8 :  9.10 8.44
    // 0.9 :  9.34 7.36 (fewer allocations (21 vs. 22), fewer cache faults)
    // 0.95: 10.21 7.48
    // copy old entries
    Cell* current = oldEntries;
    int remaining = _size;
    _nonemptyCells = 0;
    _size = 0;
    while (remaining != 0) {
      // find first occupied cell
      while (! current->occupied()) {
	current++;
      }
      // now current is occupied
      insert(current->value,current->code);
      current ++;
      remaining --;
    }

    if (oldEntries) {
      array_delete(oldEntries,oldCapacity);
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Cell),"Set::Cell");
    }
  }